

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_Internal_ExtrudedEdge::SetBothEdgeTags(ON_Internal_ExtrudedEdge *this,ON_SubDEdgeTag edge_tag)

{
  uint local_18;
  uint evi;
  ON_SubDEdgeTag edge_tag_local;
  ON_Internal_ExtrudedEdge *this_local;
  
  if (edge_tag == Crease) {
    if (this->m_original_edge != (ON_SubDEdge *)0x0) {
      this->m_original_edge->m_edge_tag = Crease;
    }
    if (this->m_copied_edge != (ON_SubDEdge *)0x0) {
      this->m_copied_edge->m_edge_tag = Crease;
    }
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      if ((this->m_extruded_vertex[local_18] != (ON_Internal_ExtrudedVertex *)0x0) &&
         (this->m_extruded_vertex[local_18]->m_connecting_edge->m_edge_tag == Unset)) {
        if (this->m_extruded_vertex[local_18]->m_initial_vertex_tag == Corner) {
          ON_Internal_ExtrudedVertex::SetBothVertexTags(this->m_extruded_vertex[local_18],Corner);
        }
        else if (this->m_extruded_vertex[local_18]->m_connecting_edge != (ON_SubDEdge *)0x0) {
          this->m_extruded_vertex[local_18]->m_connecting_edge->m_edge_tag = Smooth;
        }
      }
    }
  }
  return;
}

Assistant:

void SetBothEdgeTags(ON_SubDEdgeTag edge_tag)
  {
    if (ON_SubDEdgeTag::Crease == edge_tag)
    {
      if (nullptr != m_original_edge)
        m_original_edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      if (nullptr != m_copied_edge)
        m_copied_edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      for (unsigned evi = 0; evi < 2; ++evi)
      {
        if (nullptr != m_extruded_vertex[evi] && ON_SubDEdgeTag::Unset == m_extruded_vertex[evi]->m_connecting_edge->m_edge_tag)
        {
          if (ON_SubDVertexTag::Corner == m_extruded_vertex[evi]->m_initial_vertex_tag)
            m_extruded_vertex[evi]->SetBothVertexTags(ON_SubDVertexTag::Corner);
          else if (nullptr != m_extruded_vertex[evi]->m_connecting_edge)
            m_extruded_vertex[evi]->m_connecting_edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
        }
      }
    }
  }